

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.hpp
# Opt level: O2

void __thiscall
glu::TextureTestUtil::RenderParams::RenderParams(RenderParams *this,TextureType texType_)

{
  this->texType = texType_;
  this->samplerType = SAMPLERTYPE_FLOAT;
  this->flags = 0;
  tcu::Vector<float,_4>::Vector(&this->w,1.0);
  this->bias = 0.0;
  this->ref = 0.0;
  tcu::Vector<float,_4>::Vector(&this->colorScale,1.0);
  tcu::Vector<float,_4>::Vector(&this->colorBias,0.0);
  return;
}

Assistant:

RenderParams (TextureType texType_)
		: texType		(texType_)
		, samplerType	(SAMPLERTYPE_FLOAT)
		, flags			(0)
		, w				(1.0f)
		, bias			(0.0f)
		, ref			(0.0f)
		, colorScale	(1.0f)
		, colorBias		(0.0f)
	{
	}